

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

bool __thiscall
ON_CheckSum::SetBufferCheckSum(ON_CheckSum *this,size_t size,void *buffer,time_t time)

{
  ON__UINT32 current_remainder;
  int i;
  long lVar1;
  ulong uVar2;
  ulong count;
  bool bVar3;
  
  Zero(this);
  if (buffer == (void *)0x0 || size == 0) {
    bVar3 = size == 0;
  }
  else {
    this->m_size = size & 0xffffffff;
    uVar2 = 0x40000;
    current_remainder = 0;
    for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
      if (size == 0) {
        size = 0;
      }
      else {
        count = uVar2;
        if (size < uVar2) {
          count = size;
        }
        current_remainder = ON_CRC32(current_remainder,count,buffer);
        buffer = (void *)((long)buffer + count);
        size = size - count;
        uVar2 = uVar2 * 2;
      }
      this->m_crc[lVar1] = current_remainder;
    }
    if (size != 0) {
      current_remainder = ON_CRC32(current_remainder,size,buffer);
    }
    this->m_crc[7] = current_remainder;
    bVar3 = true;
  }
  this->m_time = time;
  return bVar3;
}

Assistant:

bool ON_CheckSum::SetBufferCheckSum( 
                size_t size, 
                const void* buffer,
                time_t time
               )
{
  bool rc = false;
  Zero();
  if ( size != 0 && buffer != 0 )
  {
    m_size = (unsigned int)size;

    ON__INT32 crc = 0;
    size_t sz, maxsize = 0x40000;
    const unsigned char* p = (const unsigned char*)buffer;
    for ( int i = 0; i < 7; i++ )
    {
      if ( size > 0 )
      {
        sz = (size > maxsize) ? maxsize : size;
        crc = ON_CRC32(crc,sz,p);
        p += sz;
        size -= sz;
        maxsize *= 2;
      }
      m_crc[i] = crc;
    }
    if ( size > 0 )
    {
      crc = ON_CRC32(crc,size,p);
    }
    m_crc[7] = crc;
    rc = true;
  }
  else if ( 0 == size )
  {
    rc = true;
  }
  m_time = time;
  return rc;
}